

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

void __thiscall google::protobuf::SourceCodeInfo::~SourceCodeInfo(SourceCodeInfo *this)

{
  ~SourceCodeInfo(this);
  operator_delete(this,0x48);
  return;
}

Assistant:

SourceCodeInfo::~SourceCodeInfo() {
  // @@protoc_insertion_point(destructor:google.protobuf.SourceCodeInfo)
  SharedDtor(*this);
}